

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  bool bVar1;
  int iVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  LocalGeneratorVector *this_00;
  reference this_01;
  pointer this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  reference __x;
  long lVar5;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *this_04;
  reference this_05;
  pointer pcVar6;
  reference pbVar7;
  string *f;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  char *sep;
  unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *sf;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *__range2_1;
  string *listFile;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listFiles;
  cmMakefile *makefile;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  LocalGeneratorVector *lgs;
  undefined1 local_228 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  undefined1 local_f0 [8];
  string s;
  undefined1 local_b0 [8];
  cmCMakePath startDir;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d [20];
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string mode;
  cmMakefile *mf;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  string *tmp;
  
  pcVar3 = cmLocalGenerator::GetMakefile(lg);
  mode.field_2._8_8_ = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_KATE_FILES_MODE",&local_69);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar3,&local_68);
  cmsys::SystemTools::UpperCase((string *)local_48,psVar4);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   gitString_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
               "\"git\": 1 ",local_7d);
    std::allocator<char>::~allocator(local_7d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         gitString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   svnString_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
               "\"svn\": 1 ",&local_7e);
    std::allocator<char>::~allocator(&local_7e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         svnString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   hgString_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
               "\"hg\": 1 ",&local_7f);
    std::allocator<char>::~allocator(&local_7f);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         hgString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   fossilString_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_,
               "\"fossil\": 1 ",&local_80);
    std::allocator<char>::~allocator(&local_80);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         fossilString_abi_cxx11_);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"SVN");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_);
    startDir.Path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_
         = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"GIT");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_);
      startDir.Path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _4_4_ = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"HG");
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)
                   &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_);
        startDir.Path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
        _4_4_ = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"FOSSIL");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,
                     (string *)
                     &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                      fossilString_abi_cxx11_);
          startDir.Path._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
          ._4_4_ = 1;
        }
        else {
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"LIST");
          if (bVar1) {
            psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
            std::__cxx11::string::string((string *)(s.field_2._M_local_buf + 8),(string *)psVar4);
            cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                      ((cmCMakePath *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&s.field_2 + 8),auto_format);
            std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
            do {
              cmCMakePath::String_abi_cxx11_(&local_110,(cmCMakePath *)local_b0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,&local_110,"/.git");
              std::__cxx11::string::~string((string *)&local_110);
              bVar1 = cmsys::SystemTools::FileExists((string *)local_f0);
              if (bVar1) {
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,
                           (string *)
                           &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                            gitString_abi_cxx11_);
                startDir.Path._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl._4_4_ = 1;
              }
              else {
                cmCMakePath::String_abi_cxx11_(&local_150,(cmCMakePath *)local_b0);
                std::operator+(&local_130,&local_150,"/.svn");
                std::__cxx11::string::operator=((string *)local_f0,(string *)&local_130);
                std::__cxx11::string::~string((string *)&local_130);
                std::__cxx11::string::~string((string *)&local_150);
                bVar1 = cmsys::SystemTools::FileExists((string *)local_f0);
                if (bVar1) {
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,
                             (string *)
                             &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                              svnString_abi_cxx11_);
                  startDir.Path._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl._4_4_ = 1;
                }
                else {
                  cmCMakePath::String_abi_cxx11_(&local_190,(cmCMakePath *)local_b0);
                  std::operator+(&local_170,&local_190,"/.hg");
                  std::__cxx11::string::operator=((string *)local_f0,(string *)&local_170);
                  std::__cxx11::string::~string((string *)&local_170);
                  std::__cxx11::string::~string((string *)&local_190);
                  bVar1 = cmsys::SystemTools::FileExists((string *)local_f0);
                  if (bVar1) {
                    std::__cxx11::string::string
                              ((string *)__return_storage_ptr__,
                               (string *)
                               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                hgString_abi_cxx11_);
                    startDir.Path._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl._4_4_ = 1;
                  }
                  else {
                    cmCMakePath::String_abi_cxx11_(&local_1d0,(cmCMakePath *)local_b0);
                    std::operator+(&local_1b0,&local_1d0,"/.fslckout");
                    std::__cxx11::string::operator=((string *)local_f0,(string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1d0);
                    bVar1 = cmsys::SystemTools::FileExists((string *)local_f0);
                    if (bVar1) {
                      std::__cxx11::string::string
                                ((string *)__return_storage_ptr__,
                                 (string *)
                                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                  fossilString_abi_cxx11_);
                      startDir.Path._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl._4_4_ = 1;
                    }
                    else {
                      bVar1 = cmCMakePath::HasRelativePath((cmCMakePath *)local_b0);
                      if (bVar1) {
                        cmCMakePath::GetParentPath
                                  ((cmCMakePath *)
                                   &files._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (cmCMakePath *)local_b0);
                        cmCMakePath::operator=
                                  ((cmCMakePath *)local_b0,
                                   (cmCMakePath *)
                                   &files._M_t._M_impl.super__Rb_tree_header._M_node_count);
                        cmCMakePath::~cmCMakePath
                                  ((cmCMakePath *)
                                   &files._M_t._M_impl.super__Rb_tree_header._M_node_count);
                        startDir.Path._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl._4_4_ = 0;
                      }
                      else {
                        startDir.Path._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl._4_4_ = 2;
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_f0);
            } while (startDir.Path._M_cmpts._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl._4_4_ == 0);
            if (startDir.Path._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl._4_4_ == 2) {
              startDir.Path._M_cmpts._M_impl._M_t.
              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
              _M_head_impl._4_4_ = 0;
            }
            cmCMakePath::~cmCMakePath((cmCMakePath *)local_b0);
            if (startDir.Path._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl._4_4_ != 0) goto LAB_0065353c;
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          this_00 = cmGlobalGenerator::GetLocalGenerators
                              ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
          __end1 = std::
                   vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ::begin(this_00);
          lgen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                 std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::end(this_00);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                             *)&lgen), bVar1) {
            this_01 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                      ::operator*(&__end1);
            this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                      operator->(this_01);
            pcVar3 = cmLocalGenerator::GetMakefile(this_02);
            this_03 = cmMakefile::GetListFiles_abi_cxx11_(pcVar3);
            __end2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(this_03);
            listFile = (string *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(this_03);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&listFile), bVar1) {
              __x = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
              lVar5 = std::__cxx11::string::find((char *)__x,0xfce2e7);
              if (lVar5 == -1) {
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_228,__x);
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end2);
            }
            this_04 = cmMakefile::GetSourceFiles(pcVar3);
            __end2_1 = std::
                       vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                       ::begin(this_04);
            sf = (unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                 std::
                 vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                 ::end(this_04);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2_1,
                                      (__normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
                                       *)&sf), bVar1) {
              this_05 = __gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
                        ::operator*(&__end2_1);
              pcVar6 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                                 (this_05);
              bVar1 = cmSourceFile::GetIsGenerated(pcVar6,GlobalAndLocal);
              if (!bVar1) {
                pcVar6 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::
                         operator->(this_05);
                psVar4 = cmSourceFile::ResolveFullPath(pcVar6,(string *)0x0,(string *)0x0);
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar4);
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_228,__return_storage_ptr__);
              }
              __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
              ::operator++(&__end2_1);
            }
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
            ::operator++(&__end1);
          }
          __range1_1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1017437;
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"\"list\": [");
          __end1_1 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_228);
          f = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_228);
          while (bVar1 = std::operator!=(&__end1_1,(_Self *)&f), bVar1) {
            pbVar7 = std::
                     _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1_1);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)__range1_1);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__," \"");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar7);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
            __range1_1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0xfdb068;
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end1_1);
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"] ");
          startDir.Path._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
          ._4_4_ = 1;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_228);
        }
      }
    }
  }
LAB_0065353c:
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator& lg) const
{
  const cmMakefile* mf = lg.GetMakefile();
  std::string mode =
    cmSystemTools::UpperCase(mf->GetSafeDefinition("CMAKE_KATE_FILES_MODE"));
  static const std::string gitString = "\"git\": 1 ";
  static const std::string svnString = "\"svn\": 1 ";
  static const std::string hgString = "\"hg\": 1 ";
  static const std::string fossilString = "\"fossil\": 1 ";

  if (mode == "SVN") {
    return svnString;
  }
  if (mode == "GIT") {
    return gitString;
  }
  if (mode == "HG") {
    return hgString;
  }
  if (mode == "FOSSIL") {
    return fossilString;
  }

  // check for the VCS files except when "forced" to "FILES" mode:
  if (mode != "LIST") {
    cmCMakePath startDir(lg.GetSourceDirectory(), cmCMakePath::auto_format);
    // move the directories up to the root directory to see whether we are in
    // a subdir of a svn, git, hg or fossil checkout
    for (;;) {
      std::string s = startDir.String() + "/.git";
      if (cmSystemTools::FileExists(s)) {
        return gitString;
      }

      s = startDir.String() + "/.svn";
      if (cmSystemTools::FileExists(s)) {
        return svnString;
      }

      s = startDir.String() + "/.hg";
      if (cmSystemTools::FileExists(s)) {
        return hgString;
      }
      s = startDir.String() + "/.fslckout";
      if (cmSystemTools::FileExists(s)) {
        return fossilString;
      }

      if (!startDir.HasRelativePath()) { // have we reached the root dir ?
        break;
      }
      startDir = startDir.GetParentPath();
    }
  }

  std::set<std::string> files;
  std::string tmp;
  const auto& lgs = this->GlobalGenerator->GetLocalGenerators();

  for (const auto& lgen : lgs) {
    cmMakefile* makefile = lgen->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::string const& listFile : listFiles) {
      if (listFile.find("/CMakeFiles/") == std::string::npos) {
        files.insert(listFile);
      }
    }

    for (const auto& sf : makefile->GetSourceFiles()) {
      if (sf->GetIsGenerated()) {
        continue;
      }

      tmp = sf->ResolveFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::string const& f : files) {
    tmp += sep;
    tmp += " \"";
    tmp += f;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}